

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void __thiscall
gl4cts::CopyImage::NonExistentMipMapTest::NonExistentMipMapTest
          (NonExistentMipMapTest *this,Context *context)

{
  vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
  *this_00;
  pointer *pptVar1;
  iterator iVar2;
  long lVar3;
  testCase test_case;
  testCase local_40;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"non_existent_mipmap",
             "Test verifies if INVALID_VALUE is generated when CopySubImageData is executed for mipmap that does not exist"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NonExistentMipMapTest_021096d8;
  lVar3 = 0;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  this_00 = &this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    local_40.m_tex_target = *(uint *)((long)&s_valid_targets + lVar3);
    local_40.m_src_level = 0;
    local_40.m_dst_level = 0;
    local_40.m_expected_result = 0;
    if (lVar3 != 0) {
      iVar2._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::NonExistentMipMapTest::testCase_const&>
                  ((vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>>
                    *)this_00,iVar2,&local_40);
      }
      else {
        (iVar2._M_current)->m_tex_target = (int)(ulong)local_40.m_tex_target;
        (iVar2._M_current)->m_src_level = (int)((ulong)local_40.m_tex_target >> 0x20);
        (iVar2._M_current)->m_dst_level = 0;
        (iVar2._M_current)->m_expected_result = 0;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      local_40.m_expected_result = 0x501;
      local_40.m_src_level = 0;
      local_40.m_dst_level = 1;
      iVar2._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::NonExistentMipMapTest::testCase_const&>
                  ((vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>>
                    *)this_00,iVar2,&local_40);
      }
      else {
        (iVar2._M_current)->m_tex_target = (int)(ulong)local_40.m_tex_target;
        (iVar2._M_current)->m_src_level = (int)((ulong)local_40.m_tex_target >> 0x20);
        (iVar2._M_current)->m_dst_level = 1;
        (iVar2._M_current)->m_expected_result = 0x501;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      local_40.m_src_level = 1;
      local_40.m_dst_level = 0;
      iVar2._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::NonExistentMipMapTest::testCase_const&>
                  ((vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>>
                    *)this_00,iVar2,&local_40);
      }
      else {
        (iVar2._M_current)->m_tex_target = local_40.m_tex_target;
        (iVar2._M_current)->m_src_level = 1;
        (iVar2._M_current)->m_dst_level = (int)((ulong)local_40.m_expected_result << 0x20);
        (iVar2._M_current)->m_expected_result =
             (int)(((ulong)local_40.m_expected_result << 0x20) >> 0x20);
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      local_40.m_src_level = 1;
      local_40.m_dst_level = 1;
      iVar2._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::NonExistentMipMapTest::testCase_const&>
                  ((vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>>
                    *)this_00,iVar2,&local_40);
      }
      else {
        (iVar2._M_current)->m_tex_target = local_40.m_tex_target;
        (iVar2._M_current)->m_src_level = 1;
        (iVar2._M_current)->m_dst_level = 1;
        (iVar2._M_current)->m_expected_result = local_40.m_expected_result;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x2c);
  return;
}

Assistant:

NonExistentMipMapTest::NonExistentMipMapTest(deqp::Context& context)
	: TestCase(context, "non_existent_mipmap", "Test verifies if INVALID_VALUE is generated when CopySubImageData is "
											   "executed for mipmap that does not exist")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];
		testCase	 test_case  = { tex_target, 0, 0, GL_NO_ERROR };

		if (GL_RENDERBUFFER == tex_target)
		{
			continue;
		}

		m_test_cases.push_back(test_case);

		/* Rest of cases is invalid */
		test_case.m_expected_result = GL_INVALID_VALUE;

		test_case.m_dst_level = 1;
		test_case.m_src_level = 0;
		m_test_cases.push_back(test_case);

		test_case.m_dst_level = 0;
		test_case.m_src_level = 1;
		m_test_cases.push_back(test_case);

		test_case.m_dst_level = 1;
		test_case.m_src_level = 1;
		m_test_cases.push_back(test_case);
	}
}